

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  undefined8 *puVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCIntersectArguments *pRVar13;
  RTCRayQueryContext *pRVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  byte bVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  Scene *pSVar31;
  ulong *puVar32;
  ulong uVar33;
  ulong unaff_R13;
  size_t mask;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined4 uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2679;
  ulong local_2678;
  RayHit *local_2670;
  RayQueryContext *local_2668;
  Scene *local_2660;
  float local_2658;
  int local_2654;
  ulong *local_2650;
  ulong local_2648;
  ulong local_2640;
  ulong local_2638;
  ulong local_2630;
  ulong local_2628;
  ulong local_2620;
  long local_2618;
  long local_2610;
  RTCFilterFunctionNArguments local_2608;
  float local_25d8;
  float local_25d4;
  float local_25d0;
  undefined4 local_25cc;
  undefined4 local_25c8;
  undefined4 local_25c4;
  uint local_25c0;
  uint local_25bc;
  uint local_25b8;
  undefined1 local_25a8 [16];
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined1 local_2588 [32];
  undefined1 local_2568 [32];
  undefined1 local_2548 [32];
  undefined1 local_2528 [32];
  undefined1 local_2508 [32];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  undefined1 *local_24b8;
  byte local_24b0;
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  float local_2458 [4];
  undefined8 local_2448;
  undefined8 uStack_2440;
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  float fVar2;
  float fVar3;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar6 = (ray->super_RayK<1>).dir.field_0;
      auVar58 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx512vl((undefined1  [16])aVar6,auVar38);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar38,auVar39,1);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar87 = ZEXT1664(auVar38);
      auVar38 = vdivps_avx512vl(auVar38,(undefined1  [16])aVar6);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar15 = (bool)((byte)uVar29 & 1);
      auVar42._0_4_ = (uint)bVar15 * auVar39._0_4_ | (uint)!bVar15 * auVar38._0_4_;
      bVar15 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar15 * auVar39._4_4_ | (uint)!bVar15 * auVar38._4_4_;
      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar15 * auVar39._8_4_ | (uint)!bVar15 * auVar38._8_4_;
      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar15 * auVar39._12_4_ | (uint)!bVar15 * auVar38._12_4_;
      auVar40._8_4_ = 0x3f7ffffa;
      auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar40._12_4_ = 0x3f7ffffa;
      auVar40 = vmulps_avx512vl(auVar42,auVar40);
      auVar41._8_4_ = 0x3f800003;
      auVar41._0_8_ = 0x3f8000033f800003;
      auVar41._12_4_ = 0x3f800003;
      auVar41 = vmulps_avx512vl(auVar42,auVar41);
      local_2508 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar88 = ZEXT3264(local_2508);
      local_2528 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar89 = ZEXT3264(local_2528);
      puVar32 = local_2368;
      local_2548 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar90 = ZEXT3264(local_2548);
      local_2568 = vbroadcastss_avx512vl(auVar40);
      auVar91 = ZEXT3264(local_2568);
      auVar38 = vmovshdup_avx(auVar40);
      local_2588 = vbroadcastsd_avx512vl(auVar38);
      auVar92 = ZEXT3264(local_2588);
      auVar39 = vshufpd_avx(auVar40,auVar40,1);
      auVar60._8_4_ = 2;
      auVar60._0_8_ = 0x200000002;
      auVar60._12_4_ = 2;
      auVar60._16_4_ = 2;
      auVar60._20_4_ = 2;
      auVar60._24_4_ = 2;
      auVar60._28_4_ = 2;
      local_23b8 = vpermps_avx2(auVar60,ZEXT1632(auVar40));
      auVar77 = ZEXT3264(local_23b8);
      uVar69 = auVar41._0_4_;
      local_23d8._4_4_ = uVar69;
      local_23d8._0_4_ = uVar69;
      local_23d8._8_4_ = uVar69;
      local_23d8._12_4_ = uVar69;
      local_23d8._16_4_ = uVar69;
      local_23d8._20_4_ = uVar69;
      local_23d8._24_4_ = uVar69;
      local_23d8._28_4_ = uVar69;
      auVar79 = ZEXT3264(local_23d8);
      auVar68._8_4_ = 1;
      auVar68._0_8_ = 0x100000001;
      auVar68._12_4_ = 1;
      auVar68._16_4_ = 1;
      auVar68._20_4_ = 1;
      auVar68._24_4_ = 1;
      auVar68._28_4_ = 1;
      local_23f8 = vpermps_avx2(auVar68,ZEXT1632(auVar41));
      auVar80 = ZEXT3264(local_23f8);
      local_2418 = vpermps_avx2(auVar60,ZEXT1632(auVar41));
      auVar81 = ZEXT3264(local_2418);
      uVar33 = (ulong)(auVar40._0_4_ < 0.0) << 5;
      local_2628 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
      local_2630 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x80;
      uVar69 = auVar58._0_4_;
      local_2438._4_4_ = uVar69;
      local_2438._0_4_ = uVar69;
      local_2438._8_4_ = uVar69;
      local_2438._12_4_ = uVar69;
      local_2438._16_4_ = uVar69;
      local_2438._20_4_ = uVar69;
      local_2438._24_4_ = uVar69;
      local_2438._28_4_ = uVar69;
      auVar82 = ZEXT3264(local_2438);
      uVar69 = auVar59._0_4_;
      auVar71 = ZEXT3264(CONCAT428(uVar69,CONCAT424(uVar69,CONCAT420(uVar69,CONCAT416(uVar69,
                                                  CONCAT412(uVar69,CONCAT48(uVar69,CONCAT44(uVar69,
                                                  uVar69))))))));
      auVar68 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar84 = ZEXT3264(auVar68);
      auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      local_2638 = uVar33 ^ 0x20;
      local_2640 = local_2628 ^ 0x20;
      local_2648 = local_2630 ^ 0x20;
      uVar29 = uVar33 ^ 0x20;
      uVar26 = local_2628;
      uVar30 = local_2630;
      uVar34 = local_2628 ^ 0x20;
      uVar35 = local_2630 ^ 0x20;
      local_2678 = uVar33;
      local_2670 = ray;
      local_2668 = context;
      do {
        do {
          do {
            if (puVar32 == &local_2378) {
              return;
            }
            pfVar8 = (float *)(puVar32 + -1);
            puVar32 = puVar32 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar8);
          uVar37 = *puVar32;
          do {
            auVar68 = auVar82._0_32_;
            if ((uVar37 & 8) == 0) {
              auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar33),
                                        auVar88._0_32_);
              auVar60 = vmulps_avx512vl(auVar91._0_32_,auVar60);
              auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar26),
                                        auVar89._0_32_);
              auVar61 = vmulps_avx512vl(auVar92._0_32_,auVar61);
              auVar60 = vmaxps_avx(auVar60,auVar61);
              auVar62 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar30),
                                        auVar90._0_32_);
              auVar61._4_4_ = auVar77._4_4_ * auVar62._4_4_;
              auVar61._0_4_ = auVar77._0_4_ * auVar62._0_4_;
              auVar61._8_4_ = auVar77._8_4_ * auVar62._8_4_;
              auVar61._12_4_ = auVar77._12_4_ * auVar62._12_4_;
              auVar61._16_4_ = auVar77._16_4_ * auVar62._16_4_;
              auVar61._20_4_ = auVar77._20_4_ * auVar62._20_4_;
              auVar61._24_4_ = auVar77._24_4_ * auVar62._24_4_;
              auVar61._28_4_ = auVar62._28_4_;
              auVar61 = vmaxps_avx(auVar61,auVar68);
              auVar63 = vmaxps_avx512vl(auVar60,auVar61);
              in_ZMM16 = ZEXT3264(auVar63);
              auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar29),
                                        auVar88._0_32_);
              auVar62._4_4_ = auVar79._4_4_ * auVar60._4_4_;
              auVar62._0_4_ = auVar79._0_4_ * auVar60._0_4_;
              auVar62._8_4_ = auVar79._8_4_ * auVar60._8_4_;
              auVar62._12_4_ = auVar79._12_4_ * auVar60._12_4_;
              auVar62._16_4_ = auVar79._16_4_ * auVar60._16_4_;
              auVar62._20_4_ = auVar79._20_4_ * auVar60._20_4_;
              auVar62._24_4_ = auVar79._24_4_ * auVar60._24_4_;
              auVar62._28_4_ = auVar60._28_4_;
              auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar34),
                                        auVar89._0_32_);
              auVar64._4_4_ = auVar80._4_4_ * auVar60._4_4_;
              auVar64._0_4_ = auVar80._0_4_ * auVar60._0_4_;
              auVar64._8_4_ = auVar80._8_4_ * auVar60._8_4_;
              auVar64._12_4_ = auVar80._12_4_ * auVar60._12_4_;
              auVar64._16_4_ = auVar80._16_4_ * auVar60._16_4_;
              auVar64._20_4_ = auVar80._20_4_ * auVar60._20_4_;
              auVar64._24_4_ = auVar80._24_4_ * auVar60._24_4_;
              auVar64._28_4_ = auVar60._28_4_;
              auVar60 = vminps_avx(auVar62,auVar64);
              auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar35),
                                        auVar90._0_32_);
              auVar83._4_4_ = auVar81._4_4_ * auVar61._4_4_;
              auVar83._0_4_ = auVar81._0_4_ * auVar61._0_4_;
              auVar83._8_4_ = auVar81._8_4_ * auVar61._8_4_;
              auVar83._12_4_ = auVar81._12_4_ * auVar61._12_4_;
              auVar83._16_4_ = auVar81._16_4_ * auVar61._16_4_;
              auVar83._20_4_ = auVar81._20_4_ * auVar61._20_4_;
              auVar83._24_4_ = auVar81._24_4_ * auVar61._24_4_;
              auVar83._28_4_ = auVar61._28_4_;
              auVar61 = vminps_avx(auVar83,auVar71._0_32_);
              auVar60 = vminps_avx(auVar60,auVar61);
              uVar19 = vcmpps_avx512vl(auVar63,auVar60,2);
              unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)(byte)uVar19);
            }
            if ((uVar37 & 8) == 0) {
              if (unaff_R13 == 0) {
                iVar24 = 4;
              }
              else {
                auVar60 = *(undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0);
                auVar61 = ((undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0))[1];
                auVar83 = auVar84._0_32_;
                auVar85 = auVar86._0_32_;
                auVar67 = in_ZMM16._0_32_;
                auVar62 = vpternlogd_avx512vl(auVar83,auVar67,auVar85,0xf8);
                uVar37 = unaff_R13 & 0xffffffff;
                auVar64 = vpcompressd_avx512vl(auVar62);
                bVar15 = (bool)((byte)uVar37 & 1);
                auVar63._0_4_ = (uint)bVar15 * auVar64._0_4_ | (uint)!bVar15 * auVar62._0_4_;
                bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar15 * auVar64._4_4_ | (uint)!bVar15 * auVar62._4_4_;
                bVar15 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar15 * auVar64._8_4_ | (uint)!bVar15 * auVar62._8_4_;
                bVar15 = (bool)((byte)(uVar37 >> 3) & 1);
                auVar63._12_4_ = (uint)bVar15 * auVar64._12_4_ | (uint)!bVar15 * auVar62._12_4_;
                bVar15 = (bool)((byte)(uVar37 >> 4) & 1);
                auVar63._16_4_ = (uint)bVar15 * auVar64._16_4_ | (uint)!bVar15 * auVar62._16_4_;
                bVar15 = (bool)((byte)(uVar37 >> 5) & 1);
                auVar63._20_4_ = (uint)bVar15 * auVar64._20_4_ | (uint)!bVar15 * auVar62._20_4_;
                bVar15 = (bool)((byte)(uVar37 >> 6) & 1);
                auVar63._24_4_ = (uint)bVar15 * auVar64._24_4_ | (uint)!bVar15 * auVar62._24_4_;
                bVar15 = (bool)((byte)(uVar37 >> 7) & 1);
                auVar63._28_4_ = (uint)bVar15 * auVar64._28_4_ | (uint)!bVar15 * auVar62._28_4_;
                auVar62 = vpermt2q_avx512vl(auVar60,auVar63,auVar61);
                uVar37 = auVar62._0_8_;
                iVar23 = 0;
                uVar28 = unaff_R13 - 1 & unaff_R13;
                iVar24 = 0;
                if (uVar28 != 0) {
                  auVar62 = vpshufd_avx2(auVar63,0x55);
                  vpermt2q_avx512vl(auVar60,auVar62,auVar61);
                  auVar64 = vpminsd_avx2(auVar63,auVar62);
                  auVar62 = vpmaxsd_avx2(auVar63,auVar62);
                  uVar28 = uVar28 - 1 & uVar28;
                  if (uVar28 == 0) {
                    auVar68 = vpermi2q_avx512vl(auVar64,auVar60,auVar61);
                    uVar37 = auVar68._0_8_;
                    auVar68 = vpermt2q_avx512vl(auVar60,auVar62,auVar61);
                    *puVar32 = auVar68._0_8_;
                    auVar68 = vpermd_avx512vl(auVar62,auVar67);
                    *(int *)(puVar32 + 1) = auVar68._0_4_;
                    puVar32 = puVar32 + 2;
                  }
                  else {
                    auVar16 = vpshufd_avx2(auVar63,0xaa);
                    vpermt2q_avx512vl(auVar60,auVar16,auVar61);
                    auVar74 = vpminsd_avx2(auVar64,auVar16);
                    auVar64 = vpmaxsd_avx2(auVar64,auVar16);
                    auVar16 = vpminsd_avx2(auVar62,auVar64);
                    auVar62 = vpmaxsd_avx2(auVar62,auVar64);
                    uVar28 = uVar28 - 1 & uVar28;
                    iVar24 = iVar23;
                    if (uVar28 == 0) {
                      auVar68 = vpermi2q_avx512vl(auVar74,auVar60,auVar61);
                      uVar37 = auVar68._0_8_;
                      auVar68 = vpermt2q_avx512vl(auVar60,auVar62,auVar61);
                      *puVar32 = auVar68._0_8_;
                      auVar68 = vpermd_avx512vl(auVar62,auVar67);
                      *(int *)(puVar32 + 1) = auVar68._0_4_;
                      auVar68 = vpermt2q_avx512vl(auVar60,auVar16,auVar61);
                      puVar32[2] = auVar68._0_8_;
                      auVar68 = vpermd_avx512vl(auVar16,auVar67);
                      *(int *)(puVar32 + 3) = auVar68._0_4_;
                      puVar32 = puVar32 + 4;
                    }
                    else {
                      auVar65 = vmovdqa64_avx512vl(auVar67);
                      auVar64 = vpshufd_avx2(auVar63,0xff);
                      vpermt2q_avx512vl(auVar60,auVar64,auVar61);
                      auVar67 = vpminsd_avx2(auVar74,auVar64);
                      auVar64 = vpmaxsd_avx2(auVar74,auVar64);
                      auVar74 = vpminsd_avx2(auVar16,auVar64);
                      auVar64 = vpmaxsd_avx2(auVar16,auVar64);
                      auVar16 = vpminsd_avx2(auVar62,auVar64);
                      auVar62 = vpmaxsd_avx2(auVar62,auVar64);
                      uVar28 = uVar28 - 1 & uVar28;
                      ray = local_2670;
                      context = local_2668;
                      uVar33 = local_2678;
                      if (uVar28 == 0) {
                        auVar64 = vpermi2q_avx512vl(auVar67,auVar60,auVar61);
                        uVar37 = auVar64._0_8_;
                        auVar64 = vpermt2q_avx512vl(auVar60,auVar62,auVar61);
                        *puVar32 = auVar64._0_8_;
                        auVar64 = vmovdqa64_avx512vl(auVar65);
                        in_ZMM16 = ZEXT3264(auVar64);
                        auVar62 = vpermd_avx512vl(auVar62,auVar65);
                        *(int *)(puVar32 + 1) = auVar62._0_4_;
                        auVar62 = vpermt2q_avx512vl(auVar60,auVar16,auVar61);
                        puVar32[2] = auVar62._0_8_;
                        auVar62 = vpermd_avx512vl(auVar16,auVar65);
                        *(int *)(puVar32 + 3) = auVar62._0_4_;
                        auVar60 = vpermt2q_avx512vl(auVar60,auVar74,auVar61);
                        puVar32[4] = auVar60._0_8_;
                        auVar60 = vpermd_avx512vl(auVar74,auVar65);
                        *(int *)(puVar32 + 5) = auVar60._0_4_;
                        puVar32 = puVar32 + 6;
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar87 = ZEXT1664(auVar58);
                        auVar88 = ZEXT3264(local_2508);
                        auVar89 = ZEXT3264(local_2528);
                        auVar90 = ZEXT3264(local_2548);
                        auVar91 = ZEXT3264(local_2568);
                        auVar92 = ZEXT3264(local_2588);
                        auVar77 = ZEXT3264(auVar77._0_32_);
                        auVar79 = ZEXT3264(auVar79._0_32_);
                        auVar80 = ZEXT3264(auVar80._0_32_);
                        auVar81 = ZEXT3264(auVar81._0_32_);
                        auVar82 = ZEXT3264(auVar68);
                        auVar84 = ZEXT3264(auVar83);
                        auVar86 = ZEXT3264(auVar85);
                      }
                      else {
                        auVar66 = valignd_avx512vl(auVar63,auVar63,3);
                        auVar64 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                        auVar63 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar64,auVar67);
                        auVar64 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar63 = vpermt2d_avx512vl(auVar63,auVar64,auVar74);
                        auVar63 = vpermt2d_avx512vl(auVar63,auVar64,auVar16);
                        auVar64 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar62 = vpermt2d_avx512vl(auVar63,auVar64,auVar62);
                        auVar82 = ZEXT3264(auVar62);
                        uVar37 = uVar28;
                        do {
                          auVar64 = auVar82._0_32_;
                          auVar74._8_4_ = 1;
                          auVar74._0_8_ = 0x100000001;
                          auVar74._12_4_ = 1;
                          auVar74._16_4_ = 1;
                          auVar74._20_4_ = 1;
                          auVar74._24_4_ = 1;
                          auVar74._28_4_ = 1;
                          auVar62 = vpermd_avx2(auVar74,auVar66);
                          auVar66 = valignd_avx512vl(auVar66,auVar66,1);
                          vpermt2q_avx512vl(auVar60,auVar66,auVar61);
                          uVar37 = uVar37 - 1 & uVar37;
                          uVar19 = vpcmpd_avx512vl(auVar62,auVar64,5);
                          auVar62 = vpmaxsd_avx2(auVar62,auVar64);
                          bVar22 = (byte)uVar19 << 1;
                          auVar64 = valignd_avx512vl(auVar64,auVar64,7);
                          bVar15 = (bool)((byte)uVar19 & 1);
                          auVar67._4_4_ =
                               (uint)bVar15 * auVar64._4_4_ | (uint)!bVar15 * auVar62._4_4_;
                          auVar67._0_4_ = auVar62._0_4_;
                          bVar15 = (bool)(bVar22 >> 2 & 1);
                          auVar67._8_4_ =
                               (uint)bVar15 * auVar64._8_4_ | (uint)!bVar15 * auVar62._8_4_;
                          bVar15 = (bool)(bVar22 >> 3 & 1);
                          auVar67._12_4_ =
                               (uint)bVar15 * auVar64._12_4_ | (uint)!bVar15 * auVar62._12_4_;
                          bVar15 = (bool)(bVar22 >> 4 & 1);
                          auVar67._16_4_ =
                               (uint)bVar15 * auVar64._16_4_ | (uint)!bVar15 * auVar62._16_4_;
                          bVar15 = (bool)(bVar22 >> 5 & 1);
                          auVar67._20_4_ =
                               (uint)bVar15 * auVar64._20_4_ | (uint)!bVar15 * auVar62._20_4_;
                          bVar15 = (bool)(bVar22 >> 6 & 1);
                          auVar67._24_4_ =
                               (uint)bVar15 * auVar64._24_4_ | (uint)!bVar15 * auVar62._24_4_;
                          auVar67._28_4_ =
                               (uint)(bVar22 >> 7) * auVar64._28_4_ |
                               (uint)!(bool)(bVar22 >> 7) * auVar62._28_4_;
                          auVar82 = ZEXT3264(auVar67);
                        } while (uVar37 != 0);
                        lVar25 = POPCOUNT(uVar28) + 3;
                        do {
                          auVar62 = vpermi2q_avx512vl(auVar67,auVar60,auVar61);
                          *puVar32 = auVar62._0_8_;
                          auVar64 = auVar82._0_32_;
                          auVar62 = vpermd_avx512vl(auVar64,auVar65);
                          *(int *)(puVar32 + 1) = auVar62._0_4_;
                          auVar67 = valignd_avx512vl(auVar64,auVar64,1);
                          puVar32 = puVar32 + 2;
                          auVar82 = ZEXT3264(auVar67);
                          lVar25 = lVar25 + -1;
                        } while (lVar25 != 0);
                        auVar60 = vpermt2q_avx512vl(auVar60,auVar67,auVar61);
                        uVar37 = auVar60._0_8_;
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar87 = ZEXT1664(auVar58);
                        auVar88 = ZEXT3264(local_2508);
                        auVar89 = ZEXT3264(local_2528);
                        auVar90 = ZEXT3264(local_2548);
                        auVar91 = ZEXT3264(local_2568);
                        auVar92 = ZEXT3264(local_2588);
                        auVar77 = ZEXT3264(auVar77._0_32_);
                        auVar79 = ZEXT3264(auVar79._0_32_);
                        auVar80 = ZEXT3264(auVar80._0_32_);
                        auVar81 = ZEXT3264(auVar81._0_32_);
                        auVar82 = ZEXT3264(auVar68);
                        auVar84 = ZEXT3264(auVar83);
                        auVar86 = ZEXT3264(auVar85);
                        auVar68 = vmovdqa64_avx512vl(auVar65);
                        in_ZMM16 = ZEXT3264(auVar68);
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar24 = 6;
            }
          } while (iVar24 == 0);
        } while (iVar24 != 6);
        local_2620 = unaff_R13;
        local_2398 = vmovdqu64_avx512vl(in_ZMM16._0_32_);
        local_2618 = (ulong)((uint)uVar37 & 0xf) - 8;
        if (local_2618 != 0) {
          uVar37 = uVar37 & 0xfffffffffffffff0;
          pSVar31 = context->scene;
          local_2610 = 0;
          local_2660 = pSVar31;
          do {
            lVar25 = local_2610 * 0x50;
            ppfVar7 = (pSVar31->vertices).items;
            pfVar8 = ppfVar7[*(uint *)(uVar37 + 0x30 + lVar25)];
            pfVar9 = ppfVar7[*(uint *)(uVar37 + 0x34 + lVar25)];
            pfVar10 = ppfVar7[*(uint *)(uVar37 + 0x38 + lVar25)];
            pfVar11 = ppfVar7[*(uint *)(uVar37 + 0x3c + lVar25)];
            auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + lVar25)),
                                    *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar37 + 8 + lVar25))
                                   );
            auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + lVar25)),
                                    *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar37 + 8 + lVar25))
                                   );
            auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 4 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar37 + 0xc + lVar25)));
            auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 4 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar37 + 0xc + lVar25)));
            auVar40 = vunpcklps_avx(auVar58,auVar59);
            auVar41 = vunpcklps_avx(auVar38,auVar39);
            auVar59 = vunpckhps_avx(auVar38,auVar39);
            auVar39 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x10 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0x18 + lVar25)));
            auVar58 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x10 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0x18 + lVar25)));
            auVar42 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar37 + 0x14 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar37 + 0x1c + lVar25)));
            auVar38 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar37 + 0x14 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar37 + 0x1c + lVar25)));
            auVar45 = vunpcklps_avx(auVar58,auVar38);
            auVar43 = vunpcklps_avx(auVar39,auVar42);
            auVar38 = vunpckhps_avx(auVar39,auVar42);
            auVar42 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x20 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0x28 + lVar25)));
            auVar58 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x20 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0x28 + lVar25)));
            auVar44 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar37 + 0x24 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar37 + 0x2c + lVar25)));
            auVar39 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar37 + 0x24 + lVar25)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar37 + 0x2c + lVar25)));
            auVar47 = vunpcklps_avx(auVar58,auVar39);
            auVar46 = vunpcklps_avx(auVar42,auVar44);
            puVar4 = (undefined8 *)(uVar37 + 0x30 + lVar25);
            local_2448 = *puVar4;
            uStack_2440 = puVar4[1];
            puVar4 = (undefined8 *)(uVar37 + 0x40 + lVar25);
            local_2598 = *puVar4;
            uStack_2590 = puVar4[1];
            auVar39 = vunpckhps_avx(auVar42,auVar44);
            local_2679 = 0;
            uVar69 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar48._4_4_ = uVar69;
            auVar48._0_4_ = uVar69;
            auVar48._8_4_ = uVar69;
            auVar48._12_4_ = uVar69;
            uVar69 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar49._4_4_ = uVar69;
            auVar49._0_4_ = uVar69;
            auVar49._8_4_ = uVar69;
            auVar49._12_4_ = uVar69;
            auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar69 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar75._4_4_ = uVar69;
            auVar75._0_4_ = uVar69;
            auVar75._8_4_ = uVar69;
            auVar75._12_4_ = uVar69;
            uVar69 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar76._4_4_ = uVar69;
            auVar76._0_4_ = uVar69;
            auVar76._8_4_ = uVar69;
            auVar76._12_4_ = uVar69;
            local_24b8 = &local_2679;
            fVar5 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar78._4_4_ = fVar5;
            auVar78._0_4_ = fVar5;
            auVar78._8_4_ = fVar5;
            auVar78._12_4_ = fVar5;
            auVar58 = vsubps_avx(auVar41,auVar48);
            auVar59 = vsubps_avx(auVar59,auVar49);
            auVar41 = vsubps_avx512vl(auVar40,auVar42);
            auVar43 = vsubps_avx512vl(auVar43,auVar48);
            auVar44 = vsubps_avx512vl(auVar38,auVar49);
            auVar45 = vsubps_avx512vl(auVar45,auVar42);
            auVar38 = vsubps_avx(auVar46,auVar48);
            auVar46 = vsubps_avx512vl(auVar39,auVar49);
            auVar42 = vsubps_avx512vl(auVar47,auVar42);
            auVar39 = vsubps_avx(auVar38,auVar58);
            auVar47 = vsubps_avx512vl(auVar46,auVar59);
            auVar48 = vsubps_avx512vl(auVar42,auVar41);
            auVar49 = vsubps_avx512vl(auVar58,auVar43);
            auVar50 = vsubps_avx512vl(auVar59,auVar44);
            auVar51 = vsubps_avx512vl(auVar41,auVar45);
            auVar52 = vsubps_avx512vl(auVar43,auVar38);
            auVar53 = vsubps_avx512vl(auVar44,auVar46);
            auVar54 = vsubps_avx512vl(auVar45,auVar42);
            auVar57._0_4_ = auVar38._0_4_ + auVar58._0_4_;
            auVar57._4_4_ = auVar38._4_4_ + auVar58._4_4_;
            auVar57._8_4_ = auVar38._8_4_ + auVar58._8_4_;
            auVar57._12_4_ = auVar38._12_4_ + auVar58._12_4_;
            auVar40 = vaddps_avx512vl(auVar46,auVar59);
            auVar55 = vaddps_avx512vl(auVar42,auVar41);
            auVar56 = vmulps_avx512vl(auVar40,auVar48);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar47,auVar55);
            auVar55 = vmulps_avx512vl(auVar55,auVar39);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar57);
            auVar72._0_4_ = auVar47._0_4_ * auVar57._0_4_;
            auVar72._4_4_ = auVar47._4_4_ * auVar57._4_4_;
            auVar72._8_4_ = auVar47._8_4_ * auVar57._8_4_;
            auVar72._12_4_ = auVar47._12_4_ * auVar57._12_4_;
            auVar40 = vfmsub231ps_fma(auVar72,auVar39,auVar40);
            auVar73._0_4_ = fVar5 * auVar40._0_4_;
            auVar73._4_4_ = fVar5 * auVar40._4_4_;
            auVar73._8_4_ = fVar5 * auVar40._8_4_;
            auVar73._12_4_ = fVar5 * auVar40._12_4_;
            auVar40 = vfmadd231ps_avx512vl(auVar73,auVar76,auVar55);
            local_24e8 = vfmadd231ps_avx512vl(auVar40,auVar75,auVar56);
            auVar40 = vaddps_avx512vl(auVar58,auVar43);
            auVar55 = vaddps_avx512vl(auVar59,auVar44);
            auVar56 = vaddps_avx512vl(auVar41,auVar45);
            auVar57 = vmulps_avx512vl(auVar55,auVar51);
            auVar57 = vfmsub231ps_avx512vl(auVar57,auVar50,auVar56);
            auVar56 = vmulps_avx512vl(auVar56,auVar49);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar40);
            auVar40 = vmulps_avx512vl(auVar40,auVar50);
            auVar40 = vfmsub231ps_avx512vl(auVar40,auVar49,auVar55);
            auVar55._0_4_ = fVar5 * auVar40._0_4_;
            auVar55._4_4_ = fVar5 * auVar40._4_4_;
            auVar55._8_4_ = fVar5 * auVar40._8_4_;
            auVar55._12_4_ = fVar5 * auVar40._12_4_;
            auVar40 = vfmadd231ps_avx512vl(auVar55,auVar76,auVar56);
            local_24d8 = vfmadd231ps_avx512vl(auVar40,auVar75,auVar57);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar71 = ZEXT1664(auVar40);
            auVar38 = vaddps_avx512vl(auVar43,auVar38);
            auVar43 = vaddps_avx512vl(auVar44,auVar46);
            auVar42 = vaddps_avx512vl(auVar45,auVar42);
            auVar45 = vmulps_avx512vl(auVar43,auVar54);
            auVar45 = vfmsub231ps_avx512vl(auVar45,auVar53,auVar42);
            auVar42 = vmulps_avx512vl(auVar42,auVar52);
            auVar42 = vfmsub231ps_avx512vl(auVar42,auVar54,auVar38);
            auVar44._0_4_ = auVar38._0_4_ * auVar53._0_4_;
            auVar44._4_4_ = auVar38._4_4_ * auVar53._4_4_;
            auVar44._8_4_ = auVar38._8_4_ * auVar53._8_4_;
            auVar44._12_4_ = auVar38._12_4_ * auVar53._12_4_;
            auVar38 = vfmsub231ps_avx512vl(auVar44,auVar52,auVar43);
            auVar38 = vmulps_avx512vl(auVar78,auVar38);
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar76,auVar42);
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar75,auVar45);
            auVar46._0_4_ = local_24d8._0_4_ + local_24e8._0_4_;
            auVar46._4_4_ = local_24d8._4_4_ + local_24e8._4_4_;
            auVar46._8_4_ = local_24d8._8_4_ + local_24e8._8_4_;
            auVar46._12_4_ = local_24d8._12_4_ + local_24e8._12_4_;
            local_24c8 = vaddps_avx512vl(auVar38,auVar46);
            auVar45._8_4_ = 0x7fffffff;
            auVar45._0_8_ = 0x7fffffff7fffffff;
            auVar45._12_4_ = 0x7fffffff;
            auVar42 = vandps_avx512vl(local_24c8,auVar45);
            auVar43._8_4_ = 0x34000000;
            auVar43._0_8_ = 0x3400000034000000;
            auVar43._12_4_ = 0x34000000;
            auVar45 = vmulps_avx512vl(auVar42,auVar43);
            auVar43 = vminps_avx512vl(local_24e8,local_24d8);
            auVar43 = vminps_avx512vl(auVar43,auVar38);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar44 = vxorps_avx512vl(auVar45,auVar44);
            uVar19 = vcmpps_avx512vl(auVar43,auVar44,5);
            auVar43 = vmaxps_avx512vl(local_24e8,local_24d8);
            auVar38 = vmaxps_avx512vl(auVar43,auVar38);
            uVar17 = vcmpps_avx512vl(auVar38,auVar45,2);
            local_24b0 = ((byte)uVar19 | (byte)uVar17) & 0xf;
            pSVar31 = local_2660;
            if (local_24b0 != 0) {
              auVar38 = vmulps_avx512vl(auVar48,auVar50);
              auVar45 = vmulps_avx512vl(auVar39,auVar51);
              auVar43 = vmulps_avx512vl(auVar47,auVar49);
              auVar44 = vmulps_avx512vl(auVar51,auVar53);
              auVar46 = vmulps_avx512vl(auVar49,auVar54);
              auVar55 = vmulps_avx512vl(auVar50,auVar52);
              auVar47 = vfmsub213ps_avx512vl(auVar47,auVar51,auVar38);
              auVar48 = vfmsub213ps_avx512vl(auVar48,auVar49,auVar45);
              auVar39 = vfmsub213ps_avx512vl(auVar39,auVar50,auVar43);
              auVar50 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar44);
              auVar51 = vfmsub213ps_avx512vl(auVar52,auVar51,auVar46);
              auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar55);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar38 = vandps_avx512vl(auVar38,auVar52);
              auVar44 = vandps_avx512vl(auVar44,auVar52);
              uVar29 = vcmpps_avx512vl(auVar38,auVar44,1);
              auVar38 = vandps_avx512vl(auVar45,auVar52);
              auVar45 = vandps_avx512vl(auVar46,auVar52);
              uVar26 = vcmpps_avx512vl(auVar38,auVar45,1);
              auVar38 = vandps_avx512vl(auVar43,auVar52);
              auVar45 = vandps_avx512vl(auVar55,auVar52);
              uVar30 = vcmpps_avx512vl(auVar38,auVar45,1);
              bVar15 = (bool)((byte)uVar29 & 1);
              local_2478._0_4_ = (uint)bVar15 * auVar47._0_4_ | (uint)!bVar15 * auVar50._0_4_;
              bVar15 = (bool)((byte)(uVar29 >> 1) & 1);
              local_2478._4_4_ = (uint)bVar15 * auVar47._4_4_ | (uint)!bVar15 * auVar50._4_4_;
              bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
              local_2478._8_4_ = (uint)bVar15 * auVar47._8_4_ | (uint)!bVar15 * auVar50._8_4_;
              bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
              local_2478._12_4_ = (uint)bVar15 * auVar47._12_4_ | (uint)!bVar15 * auVar50._12_4_;
              bVar15 = (bool)((byte)uVar26 & 1);
              local_2468._0_4_ = (uint)bVar15 * auVar48._0_4_ | (uint)!bVar15 * auVar51._0_4_;
              bVar15 = (bool)((byte)(uVar26 >> 1) & 1);
              local_2468._4_4_ = (uint)bVar15 * auVar48._4_4_ | (uint)!bVar15 * auVar51._4_4_;
              bVar15 = (bool)((byte)(uVar26 >> 2) & 1);
              local_2468._8_4_ = (uint)bVar15 * auVar48._8_4_ | (uint)!bVar15 * auVar51._8_4_;
              bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
              local_2468._12_4_ = (uint)bVar15 * auVar48._12_4_ | (uint)!bVar15 * auVar51._12_4_;
              bVar15 = (bool)((byte)uVar30 & 1);
              local_2458[0] = (float)((uint)bVar15 * auVar39._0_4_ | (uint)!bVar15 * auVar49._0_4_);
              bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
              local_2458[1] = (float)((uint)bVar15 * auVar39._4_4_ | (uint)!bVar15 * auVar49._4_4_);
              bVar15 = (bool)((byte)(uVar30 >> 2) & 1);
              local_2458[2] = (float)((uint)bVar15 * auVar39._8_4_ | (uint)!bVar15 * auVar49._8_4_);
              bVar15 = (bool)((byte)(uVar30 >> 3) & 1);
              local_2458[3] =
                   (float)((uint)bVar15 * auVar39._12_4_ | (uint)!bVar15 * auVar49._12_4_);
              auVar52._0_4_ = fVar5 * local_2458[0];
              auVar52._4_4_ = fVar5 * local_2458[1];
              auVar52._8_4_ = fVar5 * local_2458[2];
              auVar52._12_4_ = fVar5 * local_2458[3];
              auVar38 = vfmadd213ps_fma(auVar76,local_2468,auVar52);
              auVar38 = vfmadd213ps_fma(auVar75,local_2478,auVar38);
              auVar50._0_4_ = auVar38._0_4_ + auVar38._0_4_;
              auVar50._4_4_ = auVar38._4_4_ + auVar38._4_4_;
              auVar50._8_4_ = auVar38._8_4_ + auVar38._8_4_;
              auVar50._12_4_ = auVar38._12_4_ + auVar38._12_4_;
              auVar51._0_4_ = auVar41._0_4_ * local_2458[0];
              auVar51._4_4_ = auVar41._4_4_ * local_2458[1];
              auVar51._8_4_ = auVar41._8_4_ * local_2458[2];
              auVar51._12_4_ = auVar41._12_4_ * local_2458[3];
              auVar59 = vfmadd213ps_fma(auVar59,local_2468,auVar51);
              auVar59 = vfmadd213ps_fma(auVar58,local_2478,auVar59);
              auVar58 = vrcp14ps_avx512vl(auVar50);
              auVar39 = auVar87._0_16_;
              auVar38 = vfnmadd213ps_avx512vl(auVar58,auVar50,auVar39);
              auVar58 = vfmadd132ps_fma(auVar38,auVar58,auVar58);
              local_2488._0_4_ = (auVar59._0_4_ + auVar59._0_4_) * auVar58._0_4_;
              local_2488._4_4_ = (auVar59._4_4_ + auVar59._4_4_) * auVar58._4_4_;
              local_2488._8_4_ = (auVar59._8_4_ + auVar59._8_4_) * auVar58._8_4_;
              local_2488._12_4_ = (auVar59._12_4_ + auVar59._12_4_) * auVar58._12_4_;
              auVar77 = ZEXT1664(local_2488);
              uVar69 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar58._4_4_ = uVar69;
              auVar58._0_4_ = uVar69;
              auVar58._8_4_ = uVar69;
              auVar58._12_4_ = uVar69;
              uVar19 = vcmpps_avx512vl(local_2488,auVar58,0xd);
              uVar29 = CONCAT44(auVar50._4_4_,auVar50._0_4_);
              auVar47._0_8_ = uVar29 ^ 0x8000000080000000;
              auVar47._8_4_ = -auVar50._8_4_;
              auVar47._12_4_ = -auVar50._12_4_;
              fVar5 = (ray->super_RayK<1>).tfar;
              auVar59._4_4_ = fVar5;
              auVar59._0_4_ = fVar5;
              auVar59._8_4_ = fVar5;
              auVar59._12_4_ = fVar5;
              uVar17 = vcmpps_avx512vl(local_2488,auVar59,2);
              uVar18 = vcmpps_avx512vl(auVar50,auVar47,4);
              local_24b0 = (byte)uVar19 & (byte)uVar17 & (byte)uVar18 & local_24b0;
              uVar36 = (uint)local_24b0;
              if (local_24b0 != 0) {
                auVar53._8_4_ = 0x219392ef;
                auVar53._0_8_ = 0x219392ef219392ef;
                auVar53._12_4_ = 0x219392ef;
                uVar29 = vcmpps_avx512vl(auVar42,auVar53,5);
                auVar58 = vrcp14ps_avx512vl(local_24c8);
                auVar59 = vfnmadd213ps_avx512vl(local_24c8,auVar58,auVar39);
                auVar58 = vfmadd132ps_avx512vl(auVar59,auVar58,auVar58);
                fVar1 = (float)((uint)((byte)uVar29 & 1) * auVar58._0_4_);
                fVar5 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar58._4_4_);
                fVar2 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar58._8_4_);
                fVar3 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar58._12_4_);
                auVar56._0_4_ = fVar1 * local_24e8._0_4_;
                auVar56._4_4_ = fVar5 * local_24e8._4_4_;
                auVar56._8_4_ = fVar2 * local_24e8._8_4_;
                auVar56._12_4_ = fVar3 * local_24e8._12_4_;
                local_24a8 = vminps_avx512vl(auVar56,auVar39);
                auVar70._0_4_ = fVar1 * local_24d8._0_4_;
                auVar70._4_4_ = fVar5 * local_24d8._4_4_;
                auVar70._8_4_ = fVar2 * local_24d8._8_4_;
                auVar70._12_4_ = fVar3 * local_24d8._12_4_;
                local_2498 = vminps_avx512vl(auVar70,auVar39);
                auVar58 = vblendmps_avx512vl(auVar40,local_2488);
                auVar54._0_4_ =
                     (uint)(local_24b0 & 1) * auVar58._0_4_ |
                     (uint)!(bool)(local_24b0 & 1) * local_2498._0_4_;
                bVar15 = (bool)(local_24b0 >> 1 & 1);
                auVar54._4_4_ = (uint)bVar15 * auVar58._4_4_ | (uint)!bVar15 * local_2498._4_4_;
                bVar15 = (bool)(local_24b0 >> 2 & 1);
                auVar54._8_4_ = (uint)bVar15 * auVar58._8_4_ | (uint)!bVar15 * local_2498._8_4_;
                auVar54._12_4_ =
                     (uint)(local_24b0 >> 3) * auVar58._12_4_ |
                     (uint)!(bool)(local_24b0 >> 3) * local_2498._12_4_;
                auVar58 = vshufps_avx(auVar54,auVar54,0xb1);
                auVar58 = vminps_avx(auVar58,auVar54);
                auVar59 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar59,auVar58);
                uVar19 = vcmpps_avx512vl(auVar54,auVar58,0);
                bVar22 = (byte)uVar19 & local_24b0;
                if (((byte)uVar19 & local_24b0) == 0) {
                  bVar22 = local_24b0;
                }
                uVar29 = 0;
                for (uVar26 = (ulong)bVar22; (uVar26 & 1) == 0;
                    uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                  uVar29 = uVar29 + 1;
                }
                do {
                  uVar27 = *(uint *)((long)&local_2448 + uVar29 * 4);
                  pGVar12 = (pSVar31->geometries).items[uVar27].ptr;
                  auVar58 = auVar54;
                  if ((pGVar12->mask & (ray->super_RayK<1>).mask) == 0) {
                    bVar22 = ~(byte)(1 << ((uint)uVar29 & 0x1f)) & (byte)uVar36;
LAB_01fbdf95:
                    uVar36 = (uint)bVar22;
                    bVar15 = true;
                  }
                  else {
                    pRVar13 = context->args;
                    if ((pRVar13->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_2608.context = context->user;
                      local_25d8 = *(float *)(local_2478 + uVar29 * 4);
                      local_25d4 = local_2458[uVar29 - 4];
                      local_25d0 = local_2458[uVar29];
                      local_25cc = *(undefined4 *)(local_24a8 + uVar29 * 4);
                      local_25c8 = *(undefined4 *)(local_2498 + uVar29 * 4);
                      local_25c4 = *(undefined4 *)((long)&local_2598 + uVar29 * 4);
                      local_25c0 = uVar27;
                      local_25bc = (local_2608.context)->instID[0];
                      local_25b8 = (local_2608.context)->instPrimID[0];
                      local_2658 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_2488 + uVar29 * 4);
                      local_2654 = -1;
                      local_2608.valid = &local_2654;
                      local_2608.geometryUserPtr = pGVar12->userPtr;
                      local_2608.ray = (RTCRayN *)ray;
                      local_2608.hit = (RTCHitN *)&local_25d8;
                      local_2608.N = 1;
                      local_25a8 = auVar77._0_16_;
                      if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01fbe179:
                        if (pRVar13->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar13->filter)(&local_2608);
                            auVar77 = ZEXT1664(local_25a8);
                            auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar71 = ZEXT1664(auVar58);
                            auVar92 = ZEXT3264(local_2588);
                            auVar91 = ZEXT3264(local_2568);
                            auVar90 = ZEXT3264(local_2548);
                            auVar89 = ZEXT3264(local_2528);
                            auVar88 = ZEXT3264(local_2508);
                            auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar87 = ZEXT1664(auVar58);
                            ray = local_2670;
                            context = local_2668;
                            pSVar31 = local_2660;
                            uVar33 = local_2678;
                          }
                          if (*local_2608.valid == 0) goto LAB_01fbe26c;
                        }
                        (((Vec3f *)((long)local_2608.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_2608.hit;
                        (((Vec3f *)((long)local_2608.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_2608.hit + 4);
                        (((Vec3f *)((long)local_2608.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_2608.hit + 8);
                        *(float *)((long)local_2608.ray + 0x3c) = *(float *)(local_2608.hit + 0xc);
                        local_2658 = *(float *)(local_2608.hit + 0x10);
                        *(float *)((long)local_2608.ray + 0x40) = local_2658;
                        *(float *)((long)local_2608.ray + 0x44) = *(float *)(local_2608.hit + 0x14);
                        *(float *)((long)local_2608.ray + 0x48) = *(float *)(local_2608.hit + 0x18);
                        *(float *)((long)local_2608.ray + 0x4c) = *(float *)(local_2608.hit + 0x1c);
                        *(float *)((long)local_2608.ray + 0x50) = *(float *)(local_2608.hit + 0x20);
                      }
                      else {
                        local_2650 = puVar32;
                        (*pGVar12->intersectionFilterN)(&local_2608);
                        auVar77 = ZEXT1664(local_25a8);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar71 = ZEXT1664(auVar58);
                        auVar92 = ZEXT3264(local_2588);
                        auVar91 = ZEXT3264(local_2568);
                        auVar90 = ZEXT3264(local_2548);
                        auVar89 = ZEXT3264(local_2528);
                        auVar88 = ZEXT3264(local_2508);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar87 = ZEXT1664(auVar58);
                        ray = local_2670;
                        context = local_2668;
                        pSVar31 = local_2660;
                        puVar32 = local_2650;
                        uVar33 = local_2678;
                        if (*local_2608.valid != 0) goto LAB_01fbe179;
LAB_01fbe26c:
                        (ray->super_RayK<1>).tfar = local_2658;
                      }
                      fVar5 = (ray->super_RayK<1>).tfar;
                      auVar21._4_4_ = fVar5;
                      auVar21._0_4_ = fVar5;
                      auVar21._8_4_ = fVar5;
                      auVar21._12_4_ = fVar5;
                      uVar19 = vcmpps_avx512vl(auVar77._0_16_,auVar21,2);
                      bVar22 = ~(byte)(1 << ((uint)uVar29 & 0x1f)) & (byte)uVar36 & (byte)uVar19;
                      auVar58 = ZEXT416((uint)local_2658);
                      goto LAB_01fbdf95;
                    }
                    bVar15 = false;
                  }
                  if (!bVar15) {
                    fVar5 = *(float *)(local_24a8 + uVar29 * 4);
                    fVar2 = *(float *)(local_2498 + uVar29 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2488 + uVar29 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_2478 + uVar29 * 4);
                    (ray->Ng).field_0.field_0.y = local_2458[uVar29 - 4];
                    (ray->Ng).field_0.field_0.z = local_2458[uVar29];
                    ray->u = fVar5;
                    ray->v = fVar2;
                    ray->primID = *(uint *)((long)&local_2598 + uVar29 * 4);
                    ray->geomID = uVar27;
                    pRVar14 = context->user;
                    ray->instID[0] = pRVar14->instID[0];
                    ray->instPrimID[0] = pRVar14->instPrimID[0];
                    break;
                  }
                  bVar22 = (byte)uVar36;
                  if (bVar22 == 0) break;
                  auVar59 = vblendmps_avx512vl(auVar71._0_16_,auVar77._0_16_);
                  auVar54._0_4_ =
                       (uint)(bVar22 & 1) * auVar59._0_4_ |
                       (uint)!(bool)(bVar22 & 1) * auVar58._0_4_;
                  bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar15 * auVar59._4_4_ | (uint)!bVar15 * auVar58._4_4_;
                  bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar15 * auVar59._8_4_ | (uint)!bVar15 * auVar58._8_4_;
                  auVar54._12_4_ =
                       (uVar36 >> 3) * auVar59._12_4_ | (uint)!SUB41(uVar36 >> 3,0) * auVar58._12_4_
                  ;
                  auVar58 = vshufps_avx(auVar54,auVar54,0xb1);
                  auVar58 = vminps_avx(auVar58,auVar54);
                  auVar59 = vshufpd_avx(auVar58,auVar58,1);
                  auVar58 = vminps_avx(auVar59,auVar58);
                  uVar19 = vcmpps_avx512vl(auVar54,auVar58,0);
                  bVar22 = (byte)uVar19 & bVar22;
                  uVar27 = uVar36;
                  if (bVar22 != 0) {
                    uVar27 = (uint)bVar22;
                  }
                  uVar20 = 0;
                  for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                    uVar20 = uVar20 + 1;
                  }
                  uVar29 = (ulong)uVar20;
                } while( true );
              }
            }
            local_2610 = local_2610 + 1;
          } while (local_2610 != local_2618);
        }
        fVar5 = (ray->super_RayK<1>).tfar;
        auVar71 = ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416(fVar5,CONCAT412
                                                  (fVar5,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))))))))
        ;
        auVar77 = ZEXT3264(local_23b8);
        auVar79 = ZEXT3264(local_23d8);
        auVar80 = ZEXT3264(local_23f8);
        auVar81 = ZEXT3264(local_2418);
        auVar82 = ZEXT3264(local_2438);
        auVar68 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar84 = ZEXT3264(auVar68);
        auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        auVar68 = vmovdqu64_avx512vl(local_2398);
        in_ZMM16 = ZEXT3264(auVar68);
        uVar29 = local_2638;
        uVar26 = local_2628;
        uVar30 = local_2630;
        unaff_R13 = local_2620;
        uVar34 = local_2640;
        uVar35 = local_2648;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }